

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsystem.c
# Opt level: O3

FT_Memory FT_New_Memory(void)

{
  FT_Memory pFVar1;
  
  pFVar1 = (FT_Memory)malloc(0x20);
  if (pFVar1 != (FT_Memory)0x0) {
    pFVar1->user = (void *)0x0;
    pFVar1->alloc = ft_alloc;
    pFVar1->realloc = ft_realloc;
    pFVar1->free = ft_free;
  }
  return pFVar1;
}

Assistant:

FT_BASE_DEF( FT_Memory )
  FT_New_Memory( void )
  {
    FT_Memory  memory;


    memory = (FT_Memory)ft_smalloc( sizeof ( *memory ) );
    if ( memory )
    {
      memory->user    = NULL;
      memory->alloc   = ft_alloc;
      memory->realloc = ft_realloc;
      memory->free    = ft_free;
#ifdef FT_DEBUG_MEMORY
      ft_mem_debug_init( memory );
#endif
    }

    return memory;
  }